

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O2

Result __thiscall tonk::Connection::OnControlChannel(Connection *this,uint8_t *data,uint bytes)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  byte *pbVar4;
  bool bVar5;
  OutputWorker *pOVar6;
  uint8_t *puVar7;
  ostream *poVar8;
  _func_int **pp_Var9;
  uint in_ECX;
  undefined4 in_register_00000014;
  uint *puVar10;
  Result *success;
  array<unsigned_char,_4UL> *addrPtr;
  uint *puVar11;
  allocator local_1d9;
  ReadByteStream controlStream;
  stringstream ss;
  ostringstream aoStack_1a8 [8];
  uint64_t local_1a0;
  undefined8 local_198;
  undefined4 local_190;
  uchar local_18c;
  uchar uStack_18b;
  uchar uStack_18a;
  uchar uStack_189;
  uchar uStack_188;
  uchar uStack_187;
  uchar uStack_186;
  uchar uStack_185;
  undefined8 uStack_184;
  undefined4 local_17c;
  
  puVar10 = (uint *)CONCAT44(in_register_00000014,bytes);
  bVar1 = (byte)*puVar10;
  if (in_ECX < 6 || bVar1 != 0x80) {
    if (in_ECX == 3 && bVar1 == 0x85) {
      uVar2 = *(ushort *)((long)puVar10 + 1);
      *(ushort *)(data + 0xc90a) = uVar2;
      if (*(int *)(data + 0x118) < 2) {
        _ss = *(char **)(data + 0x110);
        std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
        std::operator<<((ostream *)aoStack_1a8,(string *)(data + 0x148));
        std::operator<<((ostream *)aoStack_1a8,"Peer informed its NAT router mapped port ");
        std::ostream::operator<<((ostream *)aoStack_1a8,uVar2);
        pOVar6 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)&ss);
        std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
      }
    }
    else {
      puVar11 = puVar10;
      if (in_ECX < 0x16 || bVar1 != 0x90) {
        if ((((in_ECX != 4 || bVar1 != 0xa0) || (*(byte *)((long)puVar10 + 1) != 0xa0)) ||
            (*(byte *)((long)puVar10 + 2) != 0xa0)) || (*(byte *)((long)puVar10 + 3) != 0xa0))
        goto LAB_0014577a;
        std::__cxx11::string::string
                  ((string *)&ss,"Connection closed by peer (gracefully)",&local_1d9);
        puVar7 = (uint8_t *)operator_new(0x38);
        *(char **)puVar7 = "Disconnected";
        std::__cxx11::string::string((string *)(puVar7 + 8),(string *)&ss);
        puVar7[0x28] = '\0';
        puVar7[0x29] = '\0';
        puVar7[0x2a] = '\0';
        puVar7[0x2b] = '\0';
        puVar7[0x30] = '\f';
        puVar7[0x31] = '\0';
        puVar7[0x32] = '\0';
        puVar7[0x33] = '\0';
        puVar7[0x34] = '\0';
        puVar7[0x35] = '\0';
        puVar7[0x36] = '\0';
        puVar7[0x37] = '\0';
        controlStream.Data = puVar7;
        RefCounter::StartShutdown((RefCounter *)(data + 8),0xc,(Result *)&controlStream);
        Result::~Result((Result *)&controlStream);
        std::__cxx11::string::~string((string *)&ss);
      }
      else {
        controlStream.BufferBytes = in_ECX - 1;
        _ss = (char *)((ulong)_ss & 0xffffffffffffff00);
        aoStack_1a8 = (ostringstream  [8])((ulong)aoStack_1a8 & 0xffffffff00000000);
        local_1a0 = 0;
        local_18c = '\0';
        uStack_18b = '\0';
        uStack_18a = '\0';
        uStack_189 = '\0';
        uStack_188 = '\0';
        uStack_187 = '\0';
        uStack_186 = '\0';
        uStack_185 = '\0';
        uStack_184 = 0;
        local_17c = 0;
        local_198 = 0x200000000;
        controlStream.Data = (uint8_t *)((long)puVar10 + 1);
        local_190 = 0;
        controlStream.BytesRead = 0;
        bVar5 = protocol::P2PConnectParams::Read((P2PConnectParams *)&ss,&controlStream);
        if (!bVar5) {
LAB_0014577a:
          std::__cxx11::stringstream::stringstream((stringstream *)&ss);
          poVar8 = std::operator<<((ostream *)aoStack_1a8,
                                   "Server sent invalid control channel message ");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,(uint)(byte)*puVar11);
          poVar8 = std::operator<<(poVar8," with length ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
          std::__cxx11::stringbuf::str();
          pp_Var9 = (_func_int **)operator_new(0x38);
          *pp_Var9 = (_func_int *)"Connection::onControlStreamMessage";
          std::__cxx11::string::string((string *)(pp_Var9 + 1),(string *)&controlStream);
          *(undefined4 *)(pp_Var9 + 5) = 0;
          pp_Var9[6] = (_func_int *)0x9;
          (this->super_IConnection)._vptr_IConnection = pp_Var9;
          std::__cxx11::string::~string((string *)&controlStream);
          std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
          return (Result)(ErrorResult *)this;
        }
        onP2PStartConnect((Connection *)data,(P2PConnectParams *)&ss);
      }
    }
  }
  else {
    if (*(int *)(data + 0x118) < 2) {
      _ss = *(char **)(data + 0x110);
      std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
      std::operator<<((ostream *)aoStack_1a8,(string *)(data + 0x148));
      std::operator<<((ostream *)aoStack_1a8,
                      "Remote peer set our client id and address via control channel");
      pOVar6 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)&ss);
      std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
    }
    uVar3 = *(uint *)((long)puVar10 + 1);
    puVar11 = (uint *)((long)puVar10 + 6);
    if (in_ECX == 0x16) {
      pbVar4 = (byte *)((long)puVar10 + 0xe);
      aoStack_1a8[0] = (ostringstream)pbVar4[0];
      aoStack_1a8[1] = (ostringstream)pbVar4[1];
      aoStack_1a8[2] = (ostringstream)pbVar4[2];
      aoStack_1a8[3] = (ostringstream)pbVar4[3];
      aoStack_1a8[4] = (ostringstream)pbVar4[4];
      aoStack_1a8[5] = (ostringstream)pbVar4[5];
      aoStack_1a8[6] = (ostringstream)pbVar4[6];
      aoStack_1a8[7] = (ostringstream)pbVar4[7];
      _ss = (char *)0x1;
    }
    else {
      if (in_ECX != 10) goto LAB_0014577a;
      _ss = (char *)((ulong)*puVar11 << 0x20);
      aoStack_1a8[0] = (ostringstream)0x0;
      aoStack_1a8[1] = (ostringstream)0x0;
      aoStack_1a8[2] = (ostringstream)0x0;
      aoStack_1a8[3] = (ostringstream)0x0;
      aoStack_1a8[4] = (ostringstream)0x0;
      aoStack_1a8[5] = (ostringstream)0x0;
      aoStack_1a8[6] = (ostringstream)0x0;
      aoStack_1a8[7] = (ostringstream)0x0;
    }
    local_1a0 = 0;
    asio::ip::detail::endpoint::endpoint
              ((endpoint *)&controlStream,(address *)&ss,(unsigned_short)puVar10[1]);
    setSelfAddress((Connection *)data,uVar3 & 0xffffff,(UDPAddress *)&controlStream);
  }
  (this->super_IConnection)._vptr_IConnection = (_func_int **)0x0;
  return (Result)(ErrorResult *)this;
}

Assistant:

Result Connection::OnControlChannel(const uint8_t* data, unsigned bytes)
{
    const uint8_t controlType = data[0];

    if (controlType == protocol::ControlChannel_S2C_ClientIdAndAddress &&
        bytes >= 1 + 3 + 2)
    {
        Logger.Debug("Remote peer set our client id and address via control channel");

        TONK_DEBUG_ASSERT(!ClientIdAndAddressIsSet);

        /*
            Note that it is currently safe for this event to be received
            multiple times.  If in the future we add more data then it may
            need a flag to check this being set twice.
        */
        const uint32_t id = siamese::ReadU24_LE_Min4Bytes(data + 1);
        const uint16_t port = siamese::ReadU16_LE(data + 1 + 3);

        data += 1 + 3 + 2;
        bytes -= 1 + 3 + 2;

        if (bytes == 4) // IPv4:
        {
            auto addrPtr = reinterpret_cast<const std::array<uint8_t, 4>*>(data);
            setSelfAddress(id, UDPAddress(asio::ip::address_v4(*addrPtr), port));
            return Result::Success();
        }

        if (bytes == 16) // IPv6:
        {
            auto addrPtr = reinterpret_cast<const std::array<uint8_t, 16>*>(data);
            setSelfAddress(id, UDPAddress(asio::ip::address_v6(*addrPtr), port));
            return Result::Success();
        }
    }
    else if (controlType == protocol::ControlChannel_C2S_NATExternalPort &&
        bytes == protocol::kControlNATExternalBytes)
    {
        const uint16_t port = siamese::ReadU16_LE(data + 1);

        // Peer has announced its NAT-mapped external port
        RemoteNATMapExternalPort = port;

        Logger.Debug("Peer informed its NAT router mapped port ", port);
        return Result::Success();
    }
    else if (controlType == protocol::ControlChannel_S2C_Peer2PeerConnect &&
        bytes >= 1 + protocol::P2PConnectParams::kMinBytes)
    {
        protocol::P2PConnectParams params;
        siamese::ReadByteStream controlStream(data + 1, bytes - 1);
        if (params.Read(controlStream))
        {
            onP2PStartConnect(params);
            return Result::Success();
        }
    }
    else if (controlType == protocol::ControlChannel_Disconnect &&
        bytes == protocol::kControlDisconnectBytes &&
        data[1] == protocol::ControlChannel_Disconnect &&
        data[2] == protocol::ControlChannel_Disconnect &&
        data[3] == protocol::ControlChannel_Disconnect)
    {
        SelfRefCount.StartShutdown(
            Tonk_AppRequest,
            Result("Disconnected",
                "Connection closed by peer (gracefully)",
                ErrorType::Tonk,
                Tonk_AppRequest));
        return Result::Success();
    }

    // Fall through into invalid data handler:

    TONK_DEBUG_BREAK(); // Invalid data

    std::stringstream ss;
    ss << "Server sent invalid control channel message " << (int)data[0] << " with length " << bytes;
    return Result("Connection::onControlStreamMessage", ss.str(), ErrorType::Tonk, Tonk_InvalidData);
}